

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommDummy.cpp
# Opt level: O3

void __thiscall
adios2::helper::CommImplDummy::Allgatherv
          (CommImplDummy *this,void *sendbuf,size_t sendcount,Datatype sendtype,void *recvbuf,
          size_t *recvcounts,size_t *displs,Datatype recvtype,string *hint)

{
  undefined8 extraout_RAX;
  string *in_stack_ffffffffffffffb8;
  string local_30;
  
  if (*recvcounts == sendcount) {
    Gather(this,sendbuf,sendcount,sendtype,recvbuf,sendcount,recvtype,0,in_stack_ffffffffffffffb8);
    return;
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"send and recv counts differ","");
  anon_unknown_8::CommDummyError(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void CommImplDummy::Allgatherv(const void *sendbuf, size_t sendcount, Datatype sendtype,
                               void *recvbuf, const size_t *recvcounts, const size_t *displs,
                               Datatype recvtype, const std::string &hint) const
{
    const size_t recvcount = recvcounts[0];
    if (recvcount != sendcount)
    {
        return CommDummyError("send and recv counts differ");
    }
    CommImplDummy::Gather(sendbuf, sendcount, sendtype, recvbuf, recvcount, recvtype, 0, hint);
}